

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnSimdShuffleOpExpr
          (ExprVisitorDelegate *this,SimdShuffleOpExpr *expr)

{
  WatWriter *this_00;
  Info local_50;
  
  this_00 = this->writer_;
  Opcode::GetInfo(&local_50,&expr->opcode);
  WritePuts(this_00,local_50.name,Space);
  Writef(this->writer_," 0x%08x 0x%08x 0x%08x 0x%08x",(ulong)(expr->val).v[0],
         (ulong)(expr->val).v[1],(ulong)(expr->val).v[2],(ulong)(expr->val).v[3]);
  WritePuts(this->writer_,"",Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnSimdShuffleOpExpr(
    SimdShuffleOpExpr* expr) {
  writer_->WritePutsSpace(expr->opcode.GetName());
  writer_->Writef(" 0x%08x 0x%08x 0x%08x 0x%08x", (expr->val.v[0]), (expr->val.v[1]),
                  (expr->val.v[2]), (expr->val.v[3]));
  writer_->WritePutsNewline("");
  return Result::Ok;
}